

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_info.cpp
# Opt level: O1

bool __thiscall duckdb::ConflictInfo::ConflictTargetMatches(ConflictInfo *this,Index *index)

{
  bool bVar1;
  int iVar2;
  
  if ((this->only_check_unique == true) &&
     (iVar2 = (*index->_vptr_Index[5])(index), 1 < (byte)((char)iVar2 - 1U))) {
    return false;
  }
  if (*(long *)((_Equality<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                 *)this->column_ids + 0x18) == 0) {
    return true;
  }
  bVar1 = ::std::__detail::
          _Equality<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::_M_equal((_Equality<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)this->column_ids,&(index->column_id_set)._M_h);
  return bVar1;
}

Assistant:

bool ConflictInfo::ConflictTargetMatches(Index &index) const {
	if (only_check_unique && !index.IsUnique()) {
		// We only support checking ON CONFLICT for Unique/Primary key constraints
		return false;
	}
	if (column_ids.empty()) {
		return true;
	}
	// Check whether the column ids match
	return column_ids == index.GetColumnIdSet();
}